

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O1

bool __thiscall ObjDumpParser::parseFunctionCall(ObjDumpParser *this,char **data,size_t size)

{
  char *__nptr;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *begin;
  char *begin_1;
  char *pcVar5;
  
  __nptr = *data;
  uVar3 = strtoul(__nptr,data,0x10);
  if (uVar3 != 0) {
    pcVar5 = *data;
    iVar2 = strncmp(pcVar5,":\t",2);
    if (iVar2 == 0) {
      pcVar5 = pcVar5 + 2;
      *data = pcVar5;
      lVar4 = 0;
      do {
        iVar2 = isxdigit((int)pcVar5[lVar4]);
        if (((iVar2 == 0) || (iVar2 = isxdigit((int)pcVar5[lVar4 + 1]), iVar2 == 0)) ||
           (iVar2 = isspace((int)pcVar5[lVar4 + 2]), iVar2 == 0)) {
          bVar1 = (int)lVar4 != 0;
          goto LAB_00119346;
        }
        *data = pcVar5 + lVar4 + 3;
        lVar4 = lVar4 + 3;
      } while ((int)lVar4 != 0x15);
      bVar1 = true;
LAB_00119346:
      if (bVar1) {
        pcVar5 = *data;
        iVar2 = isspace((int)*pcVar5);
        while (iVar2 != 0) {
          pcVar5 = pcVar5 + 1;
          *data = pcVar5;
          iVar2 = isspace((int)*pcVar5);
        }
        if (bVar1) {
          pcVar5 = *data;
          iVar2 = strncmp(pcVar5,"callq  ",7);
          if (iVar2 == 0) {
            pcVar5 = pcVar5 + 7;
          }
          else {
            pcVar5 = *data;
            iVar2 = strncmp(pcVar5,"call  ",6);
            if (iVar2 != 0) {
              return false;
            }
            pcVar5 = pcVar5 + 6;
          }
          *data = pcVar5;
          uVar3 = strtoul(pcVar5,data,0x10);
          if (uVar3 != 0) {
            pcVar5 = *data;
            iVar2 = strncmp(pcVar5," <",2);
            if ((iVar2 == 0) && (*data = pcVar5 + 2, __nptr[size - 1] == '>')) {
              bVar1 = ScParser::parseFunctionCall(this->m_scParser,data);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionCall(char *&data, std::size_t size)
{
    const char *const endOfData = data + size - 1;

    if (!(expectAddress(data) && expectString(data, ":\t") && expectAsmBytes(data)
          && (expectString(data, "callq  ") || expectString(data, "call  ")) && expectAddress(data)
          && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">")) {
        return false;
    }

    return m_scParser.parseFunctionCall(data);
}